

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  short *psVar1;
  ImGuiWindow **ppIVar2;
  ImGuiContext *pIVar3;
  long lVar4;
  long lVar5;
  
  pIVar3 = GImGui;
  lVar4 = (long)(GImGui->WindowsFocusOrder).Size;
  if ((GImGui->WindowsFocusOrder).Data[lVar4 + -1] != window) {
    lVar4 = lVar4 + -1;
    if ((int)window->FocusOrder < (int)lVar4) {
      lVar5 = (long)(int)window->FocusOrder;
      do {
        ppIVar2 = (pIVar3->WindowsFocusOrder).Data;
        ppIVar2[lVar5] = ppIVar2[lVar5 + 1];
        psVar1 = &(pIVar3->WindowsFocusOrder).Data[lVar5]->FocusOrder;
        *psVar1 = *psVar1 + -1;
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    (pIVar3->WindowsFocusOrder).Data[(int)lVar4] = window;
    window->FocusOrder = (short)lVar4;
  }
  return;
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == window->RootWindow);

    const int cur_order = window->FocusOrder;
    IM_ASSERT(g.WindowsFocusOrder[cur_order] == window);
    if (g.WindowsFocusOrder.back() == window)
        return;

    const int new_order = g.WindowsFocusOrder.Size - 1;
    for (int n = cur_order; n < new_order; n++)
    {
        g.WindowsFocusOrder[n] = g.WindowsFocusOrder[n + 1];
        g.WindowsFocusOrder[n]->FocusOrder--;
        IM_ASSERT(g.WindowsFocusOrder[n]->FocusOrder == n);
    }
    g.WindowsFocusOrder[new_order] = window;
    window->FocusOrder = (short)new_order;
}